

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sds.c
# Opt level: O3

int sdsull2str(char *s,unsigned_long_long v)

{
  char cVar1;
  char *pcVar2;
  char *pcVar3;
  int iVar4;
  char *p;
  bool bVar5;
  
  iVar4 = 0;
  pcVar2 = s + -1;
  do {
    pcVar3 = pcVar2;
    pcVar3[1] = (char)v + (char)(v / 10) * -10 | 0x30;
    iVar4 = iVar4 + 1;
    bVar5 = 9 < v;
    pcVar2 = pcVar3 + 1;
    v = v / 10;
  } while (bVar5);
  pcVar3[2] = '\0';
  if (s < pcVar3 + 1) {
    do {
      cVar1 = *s;
      *s = pcVar3[1];
      pcVar3[1] = cVar1;
      s = s + 1;
      bVar5 = s < pcVar3;
      pcVar3 = pcVar3 + -1;
    } while (bVar5);
  }
  return iVar4;
}

Assistant:

int sdsull2str(char *s, unsigned long long v) {
    char *p, aux;
    size_t l;

    /* Generate the string representation, this method produces
     * an reversed string. */
    p = s;
    do {
        *p++ = '0'+(v%10);
        v /= 10;
    } while(v);

    /* Compute length and add null term. */
    l = p-s;
    *p = '\0';

    /* Reverse the string. */
    p--;
    while(s < p) {
        aux = *s;
        *s = *p;
        *p = aux;
        s++;
        p--;
    }
    return l;
}